

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_send(uv_udp_send_t *req,uv_udp_t *handle,uv_buf_t *bufs,uint nbufs,sockaddr *addr,
                uint addrlen,uv_udp_send_cb send_cb)

{
  size_t sVar1;
  int iVar2;
  uv_buf_t *puVar3;
  size_t sVar4;
  int empty_queue;
  int err;
  uint addrlen_local;
  sockaddr *addr_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_udp_t *handle_local;
  uv_udp_send_t *req_local;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0x2b8,
                  "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                 );
  }
  if ((addr == (sockaddr *)0x0) ||
     (req_local._4_4_ = uv__udp_maybe_deferred_bind(handle,(uint)addr->sa_family,0),
     req_local._4_4_ == 0)) {
    sVar1 = handle->send_queue_count;
    req->loop = handle->loop;
    req->type = UV_UDP_SEND;
    (handle->loop->active_reqs).count = (handle->loop->active_reqs).count + 1;
    if (0x80 < addrlen) {
      __assert_fail("addrlen <= sizeof(req->addr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                    ,0x2c7,
                    "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                   );
    }
    if (addr == (sockaddr *)0x0) {
      (req->addr).ss_family = 0;
    }
    else {
      memcpy(&req->addr,addr,(ulong)addrlen);
    }
    req->send_cb = send_cb;
    req->handle = handle;
    req->nbufs = nbufs;
    req->bufs = req->bufsml;
    if (4 < nbufs) {
      puVar3 = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
      req->bufs = puVar3;
    }
    if (req->bufs == (uv_buf_t *)0x0) {
      if ((handle->loop->active_reqs).count == 0) {
        __assert_fail("uv__has_active_reqs(handle->loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                      ,0x2d5,
                      "int uv__udp_send(uv_udp_send_t *, uv_udp_t *, const uv_buf_t *, unsigned int, const struct sockaddr *, unsigned int, uv_udp_send_cb)"
                     );
      }
      (handle->loop->active_reqs).count = (handle->loop->active_reqs).count - 1;
      req_local._4_4_ = -0xc;
    }
    else {
      memcpy(req->bufs,bufs,(ulong)nbufs << 4);
      sVar4 = uv__count_bufs(req->bufs,req->nbufs);
      handle->send_queue_size = sVar4 + handle->send_queue_size;
      handle->send_queue_count = handle->send_queue_count + 1;
      uv__queue_insert_tail(&handle->write_queue,&req->queue);
      if (((handle->flags & 4) == 0) &&
         (handle->flags = handle->flags | 4, (handle->flags & 8) != 0)) {
        handle->loop->active_handles = handle->loop->active_handles + 1;
      }
      if ((sVar1 == 0) && ((handle->flags & 0x1000000) == 0)) {
        uv__udp_sendmsg(handle);
        iVar2 = uv__queue_empty(&handle->write_queue);
        if (iVar2 == 0) {
          uv__io_start(handle->loop,&handle->io_watcher,4);
        }
      }
      else {
        uv__io_start(handle->loop,&handle->io_watcher,4);
      }
      req_local._4_4_ = 0;
    }
  }
  return req_local._4_4_;
}

Assistant:

int uv__udp_send(uv_udp_send_t* req,
                 uv_udp_t* handle,
                 const uv_buf_t bufs[],
                 unsigned int nbufs,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 uv_udp_send_cb send_cb) {
  int err;
  int empty_queue;

  assert(nbufs > 0);

  if (addr) {
    err = uv__udp_maybe_deferred_bind(handle, addr->sa_family, 0);
    if (err)
      return err;
  }

  /* It's legal for send_queue_count > 0 even when the write_queue is empty;
   * it means there are error-state requests in the write_completed_queue that
   * will touch up send_queue_size/count later.
   */
  empty_queue = (handle->send_queue_count == 0);

  uv__req_init(handle->loop, req, UV_UDP_SEND);
  assert(addrlen <= sizeof(req->addr));
  if (addr == NULL)
    req->addr.ss_family = AF_UNSPEC;
  else
    memcpy(&req->addr, addr, addrlen);
  req->send_cb = send_cb;
  req->handle = handle;
  req->nbufs = nbufs;

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL) {
    uv__req_unregister(handle->loop, req);
    return UV_ENOMEM;
  }

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  handle->send_queue_size += uv__count_bufs(req->bufs, req->nbufs);
  handle->send_queue_count++;
  uv__queue_insert_tail(&handle->write_queue, &req->queue);
  uv__handle_start(handle);

  if (empty_queue && !(handle->flags & UV_HANDLE_UDP_PROCESSING)) {
    uv__udp_sendmsg(handle);

    /* `uv__udp_sendmsg` may not be able to do non-blocking write straight
     * away. In such cases the `io_watcher` has to be queued for asynchronous
     * write.
     */
    if (!uv__queue_empty(&handle->write_queue))
      uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);
  } else {
    uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);
  }

  return 0;
}